

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_map_s.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
estl::
sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
::operator[](sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
             *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  bool bVar1;
  iterator pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  
  bVar1 = key_is_last_element(this,key);
  if (bVar1) {
    pvVar2 = (this->data_vec_).data_ptr_ + ((this->data_vec_).size_ - 1);
  }
  else {
    pvVar2 = do_find(this,key);
    if (pvVar2 == (this->data_vec_).data_ptr_ + (this->data_vec_).size_) {
      local_80._M_string_length = 0;
      local_80.field_2._M_local_buf[0] = '\0';
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_60,key,&local_80);
      pvVar2 = do_insert_raw(this,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.second._M_dataplus._M_p != &local_60.second.field_2) {
        operator_delete(local_60.second._M_dataplus._M_p,
                        local_60.second.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
        operator_delete(local_60.first._M_dataplus._M_p,
                        local_60.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,
                        CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                 local_80.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  return &pvVar2->second;
}

Assistant:

T& operator[]( const Key& key )
    {
        if (key_is_last_element(key)) {
            return data_vec_.back().second;
        }
        iterator it = do_find(key);
        if (it == end()) {
            it = do_insert_raw({key,T()});
        }
        return it->second;
    }